

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O2

void __thiscall SpecificStrategy::matchEdges(SpecificStrategy *this,Edge *aEdges,Edge *bEdges)

{
  _Rb_tree_header *p_Var1;
  anon_struct_96_2_85a1d427_for_internal_external *this_00;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  iterator iVar4;
  iterator iVar5;
  _Self __tmp;
  
  iVar5._M_node = (bEdges->internal).perfect._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(aEdges->internal).perfect._M_t._M_impl.super__Rb_tree_header;
  this_00 = &aEdges->external;
  p_Var2 = &(aEdges->external).perfect._M_t._M_impl.super__Rb_tree_header;
  do {
    while( true ) {
      if ((_Rb_tree_header *)iVar5._M_node ==
          &(bEdges->internal).perfect._M_t._M_impl.super__Rb_tree_header) {
        iVar5._M_node =
             (bEdges->external).perfect._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while ((_Rb_tree_header *)iVar5._M_node !=
               &(bEdges->external).perfect._M_t._M_impl.super__Rb_tree_header) {
          p_Var3 = iVar5._M_node + 1;
          iVar4 = std::
                  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                  ::find((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                          *)this_00,p_Var3);
          if ((_Rb_tree_header *)iVar4._M_node == p_Var2) {
            iVar4 = std::
                    _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                    ::find((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                            *)aEdges,p_Var3);
            if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
              iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node);
            }
            else {
              std::
              _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
              ::_M_insert_unique<CfgData::Edge_const&>
                        ((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                          *)&(aEdges->internal).conflict,(Edge *)(iVar4._M_node + 1));
              std::
              _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
              ::erase_abi_cxx11_((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                                  *)aEdges,(const_iterator)iVar4._M_node);
              std::
              _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
              ::_M_insert_unique<CfgData::Edge_const&>
                        ((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                          *)&(bEdges->external).conflict,(Edge *)p_Var3);
              iVar5 = std::
                      _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                      ::erase_abi_cxx11_((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                                          *)&bEdges->external,iVar5._M_node);
            }
          }
          else {
            iVar5 = std::
                    _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                    ::erase_abi_cxx11_((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                                        *)&bEdges->external,iVar5._M_node);
          }
        }
        return;
      }
      p_Var3 = iVar5._M_node + 1;
      iVar4 = std::
              _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
              ::find((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                      *)aEdges,p_Var3);
      if ((_Rb_tree_header *)iVar4._M_node == p_Var1) break;
LAB_0010ca54:
      iVar5 = std::
              _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
              ::erase_abi_cxx11_((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                                  *)bEdges,iVar5._M_node);
    }
    iVar4 = std::
            _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
            ::find((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                    *)this_00,p_Var3);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var2) {
      std::
      _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
      ::_M_insert_unique<CfgData::Edge_const&>
                ((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                  *)&(aEdges->external).conflict,(Edge *)(iVar4._M_node + 1));
      std::
      _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
      ::erase_abi_cxx11_((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                          *)this_00,(const_iterator)iVar4._M_node);
      std::
      _Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
      ::_M_insert_unique<CfgData::Edge_const&>
                ((_Rb_tree<CfgData::Edge,CfgData::Edge,std::_Identity<CfgData::Edge>,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                  *)&(bEdges->internal).conflict,(Edge *)p_Var3);
      goto LAB_0010ca54;
    }
    iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node);
  } while( true );
}

Assistant:

void SpecificStrategy::matchEdges(SpecificStrategy::Info::Edge& aEdges,
		SpecificStrategy::Info::Edge& bEdges) {
	for (std::set<CfgData::Edge>::iterator bIT = bEdges.internal.perfect.begin(),
			bED = bEdges.internal.perfect.end(); bIT != bED; ) {
		std::set<CfgData::Edge>::iterator aIT = aEdges.internal.perfect.find(*bIT),
				aED = aEdges.internal.perfect.end();
		if (aIT != aED) {
			bIT = bEdges.internal.perfect.erase(bIT);
			continue;
		}

		aIT = aEdges.external.perfect.find(*bIT),
				aED = aEdges.external.perfect.end();
		if (aIT != aED) {
			aEdges.external.conflict.insert(*aIT);
			aEdges.external.perfect.erase(aIT);

			bEdges.internal.conflict.insert(*bIT);
			bIT = bEdges.internal.perfect.erase(bIT);
			continue;
		}

		bIT++;
	}

	for (std::set<CfgData::Edge>::iterator bIT = bEdges.external.perfect.begin(),
			bED = bEdges.external.perfect.end(); bIT != bED; ) {
		std::set<CfgData::Edge>::iterator aIT = aEdges.external.perfect.find(*bIT),
				aED = aEdges.external.perfect.end();
		if (aIT != aED) {
			bIT = bEdges.external.perfect.erase(bIT);
			continue;
		}

		aIT = aEdges.internal.perfect.find(*bIT),
				aED = aEdges.internal.perfect.end();
		if (aIT != aED) {
			aEdges.internal.conflict.insert(*aIT);
			aEdges.internal.perfect.erase(aIT);

			bEdges.external.conflict.insert(*bIT);
			bIT = bEdges.external.perfect.erase(bIT);
			continue;
		}

		bIT++;
	}
}